

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O0

void __thiscall
SceneRender::commandsInit(SceneRender *this,CommandList *_commands,Uniforms *_uniforms)

{
  Uniforms *pUVar1;
  allocator local_e11;
  string local_e10;
  allocator local_de9;
  string local_de8;
  anon_class_8_1_8991fb9c local_dc8;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_dc0;
  allocator local_d99;
  string local_d98;
  Command local_d78;
  allocator local_ce9;
  string local_ce8;
  allocator local_cc1;
  string local_cc0;
  anon_class_8_1_8991fb9c local_ca0;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_c98;
  allocator local_c71;
  string local_c70;
  Command local_c50;
  allocator local_bc1;
  string local_bc0;
  allocator local_b99;
  string local_b98;
  anon_class_8_1_8991fb9c local_b78;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_b70;
  allocator local_b49;
  string local_b48;
  Command local_b28;
  allocator local_a99;
  string local_a98;
  allocator local_a71;
  string local_a70;
  anon_class_8_1_8991fb9c local_a50;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_a48;
  allocator local_a21;
  string local_a20;
  Command local_a00;
  allocator local_971;
  string local_970;
  allocator local_949;
  string local_948;
  anon_class_16_2_58a6230b local_928;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_918;
  allocator local_8f1;
  string local_8f0;
  Command local_8d0;
  allocator local_841;
  string local_840;
  allocator local_819;
  string local_818;
  anon_class_8_1_8991fb9c local_7f8;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_7f0;
  allocator local_7c9;
  string local_7c8;
  Command local_7a8;
  allocator local_719;
  string local_718;
  allocator local_6f1;
  string local_6f0;
  anon_class_8_1_8991fb9c local_6d0;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_6c8;
  allocator local_6a1;
  string local_6a0;
  Command local_680;
  allocator local_5f1;
  string local_5f0;
  allocator local_5c9;
  string local_5c8;
  anon_class_8_1_8991fb9c local_5a8;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_5a0;
  allocator local_579;
  string local_578;
  Command local_558;
  allocator local_4c9;
  string local_4c8;
  allocator local_4a1;
  string local_4a0;
  anon_class_8_1_8991fb9c local_480;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_478;
  allocator local_451;
  string local_450;
  Command local_430;
  allocator local_3a1;
  string local_3a0;
  allocator local_379;
  string local_378;
  anon_class_8_1_08d3153e local_358;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_350;
  allocator local_329;
  string local_328;
  Command local_308;
  allocator local_279;
  string local_278;
  allocator local_251;
  string local_250;
  anon_class_8_1_8991fb9c local_230;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_228;
  allocator local_201;
  string local_200;
  Command local_1e0;
  allocator local_151;
  string local_150;
  allocator local_129;
  string local_128;
  anon_class_8_1_08d3153e local_108;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_100;
  allocator local_c9;
  string local_c8;
  Command local_a8;
  Uniforms *local_20;
  Uniforms *_uniforms_local;
  CommandList *_commands_local;
  SceneRender *this_local;
  
  if ((this->m_commands_loaded & 1U) == 0) {
    local_20 = _uniforms;
    _uniforms_local = (Uniforms *)_commands;
    _commands_local = (CommandList *)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,"model",&local_c9);
    local_108._uniforms = local_20;
    std::function<bool(std::__cxx11::string_const&)>::
    function<SceneRender::commandsInit(std::vector<Command,std::allocator<Command>>&,Uniforms&)::__0,void>
              ((function<bool(std::__cxx11::string_const&)> *)&local_100,&local_108);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_128,"models",&local_129);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_150,"print all the names of the models",&local_151);
    Command::Command(&local_a8,&local_c8,&local_100,&local_128,&local_150,true);
    std::vector<Command,_std::allocator<Command>_>::push_back(_commands,&local_a8);
    Command::~Command(&local_a8);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    std::
    function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_100);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    pUVar1 = _uniforms_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_200,"origin",&local_201);
    local_230.this = this;
    std::function<bool(std::__cxx11::string_const&)>::
    function<SceneRender::commandsInit(std::vector<Command,std::allocator<Command>>&,Uniforms&)::__1,void>
              ((function<bool(std::__cxx11::string_const&)> *)&local_228,&local_230);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_250,"origin[,<x>,<y>,<z>]",&local_251);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_278,"get or set the origin position.",&local_279);
    Command::Command(&local_1e0,&local_200,&local_228,&local_250,&local_278,true);
    std::vector<Command,_std::allocator<Command>_>::push_back
              ((vector<Command,_std::allocator<Command>_> *)pUVar1,&local_1e0);
    Command::~Command(&local_1e0);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator((allocator<char> *)&local_279);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator((allocator<char> *)&local_251);
    std::
    function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_228);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
    pUVar1 = _uniforms_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_328,"material",&local_329);
    local_358._uniforms = local_20;
    std::function<bool(std::__cxx11::string_const&)>::
    function<SceneRender::commandsInit(std::vector<Command,std::allocator<Command>>&,Uniforms&)::__2,void>
              ((function<bool(std::__cxx11::string_const&)> *)&local_350,&local_358);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_378,"materials",&local_379);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3a0,"print all the materials names",&local_3a1);
    Command::Command(&local_308,&local_328,&local_350,&local_378,&local_3a0,true);
    std::vector<Command,_std::allocator<Command>_>::push_back
              ((vector<Command,_std::allocator<Command>_> *)pUVar1,&local_308);
    Command::~Command(&local_308);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
    std::__cxx11::string::~string((string *)&local_378);
    std::allocator<char>::~allocator((allocator<char> *)&local_379);
    std::
    function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_350);
    std::__cxx11::string::~string((string *)&local_328);
    std::allocator<char>::~allocator((allocator<char> *)&local_329);
    pUVar1 = _uniforms_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_450,"blend",&local_451);
    local_480.this = this;
    std::function<bool(std::__cxx11::string_const&)>::
    function<SceneRender::commandsInit(std::vector<Command,std::allocator<Command>>&,Uniforms&)::__3,void>
              ((function<bool(std::__cxx11::string_const&)> *)&local_478,&local_480);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_4a0,"blend[,alpha|add|multiply|screen|substract]",&local_4a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4c8,"get or set the blending modes",&local_4c9);
    Command::Command(&local_430,&local_450,&local_478,&local_4a0,&local_4c8,true);
    std::vector<Command,_std::allocator<Command>_>::push_back
              ((vector<Command,_std::allocator<Command>_> *)pUVar1,&local_430);
    Command::~Command(&local_430);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
    std::
    function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_478);
    std::__cxx11::string::~string((string *)&local_450);
    std::allocator<char>::~allocator((allocator<char> *)&local_451);
    pUVar1 = _uniforms_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_578,"depth_test",&local_579);
    local_5a8.this = this;
    std::function<bool(std::__cxx11::string_const&)>::
    function<SceneRender::commandsInit(std::vector<Command,std::allocator<Command>>&,Uniforms&)::__4,void>
              ((function<bool(std::__cxx11::string_const&)> *)&local_5a0,&local_5a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5c8,"depth_test[,on|off]",&local_5c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5f0,"turn on/off depth test",&local_5f1);
    Command::Command(&local_558,&local_578,&local_5a0,&local_5c8,&local_5f0,true);
    std::vector<Command,_std::allocator<Command>_>::push_back
              ((vector<Command,_std::allocator<Command>_> *)pUVar1,&local_558);
    Command::~Command(&local_558);
    std::__cxx11::string::~string((string *)&local_5f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5f1);
    std::__cxx11::string::~string((string *)&local_5c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5c9);
    std::
    function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_5a0);
    std::__cxx11::string::~string((string *)&local_578);
    std::allocator<char>::~allocator((allocator<char> *)&local_579);
    pUVar1 = _uniforms_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6a0,"culling",&local_6a1);
    local_6d0.this = this;
    std::function<bool(std::__cxx11::string_const&)>::
    function<SceneRender::commandsInit(std::vector<Command,std::allocator<Command>>&,Uniforms&)::__5,void>
              ((function<bool(std::__cxx11::string_const&)> *)&local_6c8,&local_6d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6f0,"culling[,none|front|back|both]",&local_6f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_718,"get or set the culling modes",&local_719);
    Command::Command(&local_680,&local_6a0,&local_6c8,&local_6f0,&local_718,true);
    std::vector<Command,_std::allocator<Command>_>::push_back
              ((vector<Command,_std::allocator<Command>_> *)pUVar1,&local_680);
    Command::~Command(&local_680);
    std::__cxx11::string::~string((string *)&local_718);
    std::allocator<char>::~allocator((allocator<char> *)&local_719);
    std::__cxx11::string::~string((string *)&local_6f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6f1);
    std::
    function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_6c8);
    std::__cxx11::string::~string((string *)&local_6a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6a1);
    pUVar1 = _uniforms_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_7c8,"dynamic_shadows",&local_7c9);
    local_7f8.this = this;
    std::function<bool(std::__cxx11::string_const&)>::
    function<SceneRender::commandsInit(std::vector<Command,std::allocator<Command>>&,Uniforms&)::__6,void>
              ((function<bool(std::__cxx11::string_const&)> *)&local_7f0,&local_7f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_818,"dynamic_shadows[,on|off]",&local_819);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_840,"get or set dynamic shadows",&local_841);
    Command::Command(&local_7a8,&local_7c8,&local_7f0,&local_818,&local_840,true);
    std::vector<Command,_std::allocator<Command>_>::push_back
              ((vector<Command,_std::allocator<Command>_> *)pUVar1,&local_7a8);
    Command::~Command(&local_7a8);
    std::__cxx11::string::~string((string *)&local_840);
    std::allocator<char>::~allocator((allocator<char> *)&local_841);
    std::__cxx11::string::~string((string *)&local_818);
    std::allocator<char>::~allocator((allocator<char> *)&local_819);
    std::
    function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_7f0);
    std::__cxx11::string::~string((string *)&local_7c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_7c9);
    pUVar1 = _uniforms_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_8f0,"floor_color",&local_8f1);
    local_928._uniforms = local_20;
    local_928.this = this;
    std::function<bool(std::__cxx11::string_const&)>::
    function<SceneRender::commandsInit(std::vector<Command,std::allocator<Command>>&,Uniforms&)::__7,void>
              ((function<bool(std::__cxx11::string_const&)> *)&local_918,&local_928);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_948,"floor_color[,<r>,<g>,<b>]",&local_949);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_970,"get or set the ground color of the skybox.",&local_971);
    Command::Command(&local_8d0,&local_8f0,&local_918,&local_948,&local_970,true);
    std::vector<Command,_std::allocator<Command>_>::push_back
              ((vector<Command,_std::allocator<Command>_> *)pUVar1,&local_8d0);
    Command::~Command(&local_8d0);
    std::__cxx11::string::~string((string *)&local_970);
    std::allocator<char>::~allocator((allocator<char> *)&local_971);
    std::__cxx11::string::~string((string *)&local_948);
    std::allocator<char>::~allocator((allocator<char> *)&local_949);
    std::
    function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_918);
    std::__cxx11::string::~string((string *)&local_8f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_8f1);
    pUVar1 = _uniforms_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a20,"floor",&local_a21);
    local_a50.this = this;
    std::function<bool(std::__cxx11::string_const&)>::
    function<SceneRender::commandsInit(std::vector<Command,std::allocator<Command>>&,Uniforms&)::__8,void>
              ((function<bool(std::__cxx11::string_const&)> *)&local_a48,&local_a50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a70,"floor[,on|off|<subD_level>]",&local_a71);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_a98,"show/hide floor or presice the subdivision level",&local_a99);
    Command::Command(&local_a00,&local_a20,&local_a48,&local_a70,&local_a98,true);
    std::vector<Command,_std::allocator<Command>_>::push_back
              ((vector<Command,_std::allocator<Command>_> *)pUVar1,&local_a00);
    Command::~Command(&local_a00);
    std::__cxx11::string::~string((string *)&local_a98);
    std::allocator<char>::~allocator((allocator<char> *)&local_a99);
    std::__cxx11::string::~string((string *)&local_a70);
    std::allocator<char>::~allocator((allocator<char> *)&local_a71);
    std::
    function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_a48);
    std::__cxx11::string::~string((string *)&local_a20);
    std::allocator<char>::~allocator((allocator<char> *)&local_a21);
    pUVar1 = _uniforms_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b48,"grid",&local_b49);
    local_b78.this = this;
    std::function<bool(std::__cxx11::string_const&)>::
    function<SceneRender::commandsInit(std::vector<Command,std::allocator<Command>>&,Uniforms&)::__9,void>
              ((function<bool(std::__cxx11::string_const&)> *)&local_b70,&local_b78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b98,"grid[,on|off]",&local_b99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_bc0,"show/hide grid",&local_bc1);
    Command::Command(&local_b28,&local_b48,&local_b70,&local_b98,&local_bc0,true);
    std::vector<Command,_std::allocator<Command>_>::push_back
              ((vector<Command,_std::allocator<Command>_> *)pUVar1,&local_b28);
    Command::~Command(&local_b28);
    std::__cxx11::string::~string((string *)&local_bc0);
    std::allocator<char>::~allocator((allocator<char> *)&local_bc1);
    std::__cxx11::string::~string((string *)&local_b98);
    std::allocator<char>::~allocator((allocator<char> *)&local_b99);
    std::
    function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_b70);
    std::__cxx11::string::~string((string *)&local_b48);
    std::allocator<char>::~allocator((allocator<char> *)&local_b49);
    pUVar1 = _uniforms_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c70,"axis",&local_c71);
    local_ca0.this = this;
    std::function<bool(std::__cxx11::string_const&)>::
    function<SceneRender::commandsInit(std::vector<Command,std::allocator<Command>>&,Uniforms&)::__10,void>
              ((function<bool(std::__cxx11::string_const&)> *)&local_c98,&local_ca0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_cc0,"axis[,on|off]",&local_cc1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_ce8,"show/hide axis",&local_ce9);
    Command::Command(&local_c50,&local_c70,&local_c98,&local_cc0,&local_ce8,true);
    std::vector<Command,_std::allocator<Command>_>::push_back
              ((vector<Command,_std::allocator<Command>_> *)pUVar1,&local_c50);
    Command::~Command(&local_c50);
    std::__cxx11::string::~string((string *)&local_ce8);
    std::allocator<char>::~allocator((allocator<char> *)&local_ce9);
    std::__cxx11::string::~string((string *)&local_cc0);
    std::allocator<char>::~allocator((allocator<char> *)&local_cc1);
    std::
    function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_c98);
    std::__cxx11::string::~string((string *)&local_c70);
    std::allocator<char>::~allocator((allocator<char> *)&local_c71);
    pUVar1 = _uniforms_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d98,"bboxes",&local_d99);
    local_dc8.this = this;
    std::function<bool(std::__cxx11::string_const&)>::
    function<SceneRender::commandsInit(std::vector<Command,std::allocator<Command>>&,Uniforms&)::__11,void>
              ((function<bool(std::__cxx11::string_const&)> *)&local_dc0,&local_dc8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_de8,"bboxes[,on|off]",&local_de9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e10,"show/hide models bounding boxes",&local_e11);
    Command::Command(&local_d78,&local_d98,&local_dc0,&local_de8,&local_e10,true);
    std::vector<Command,_std::allocator<Command>_>::push_back
              ((vector<Command,_std::allocator<Command>_> *)pUVar1,&local_d78);
    Command::~Command(&local_d78);
    std::__cxx11::string::~string((string *)&local_e10);
    std::allocator<char>::~allocator((allocator<char> *)&local_e11);
    std::__cxx11::string::~string((string *)&local_de8);
    std::allocator<char>::~allocator((allocator<char> *)&local_de9);
    std::
    function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_dc0);
    std::__cxx11::string::~string((string *)&local_d98);
    std::allocator<char>::~allocator((allocator<char> *)&local_d99);
    this->m_commands_loaded = true;
  }
  return;
}

Assistant:

void SceneRender::commandsInit(CommandList& _commands, Uniforms& _uniforms) {
    if (!m_commands_loaded) {

        // ADD COMMANDS
        // ----------------------------------------- 
        _commands.push_back(Command("model", [&](const std::string& _line){ 
            if (_line == "models") {
                for (vera::ModelsMap::iterator it = _uniforms.models.begin(); it != _uniforms.models.end(); ++it)
                    std::cout << it->second->getName() << std::endl;
                return true;
            }
            else {
                std::vector<std::string> values = vera::split(_line,',');
                if (values.size() == 2) {
                    for (vera::ModelsMap::iterator it = _uniforms.models.begin(); it != _uniforms.models.end(); ++it)
                        if (it->second->getName() == values[1]) {
                            it->second->printVboInfo();
                            std::cout << "Defines:" << std::endl;
                            it->second->printDefines();
                            std::cout << "Position:" << std::endl;
                            glm::vec3 pos = it->second->getPosition();
                            std::cout << pos.x << ',' << pos.y << ',' << pos.z << std::endl;
                            return true;
                        }
                }
                else if (values.size() == 5) {
                    for (vera::ModelsMap::iterator it = _uniforms.models.begin(); it != _uniforms.models.end(); ++it)
                        if (it->second->getName() == values[1]) {
                            it->second->setPosition( glm::vec3(vera::toFloat(values[2]), vera::toFloat(values[3]), vera::toFloat(values[4])) );
                            return true;
                        }
                }
            }
            return false;
        },
        "models", "print all the names of the models"));

        _commands.push_back(Command("origin", [&](const std::string& _line){ 
            std::vector<std::string> values = vera::split(_line,',');
            if (values.size() == 4) {
                m_origin.setPosition( glm::vec3(vera::toFloat(values[1]), vera::toFloat(values[2]), vera::toFloat(values[3])) );
                return true;
            }
            else {
                glm::vec3 pos = m_origin.getPosition();
                std::cout << pos.x << ',' << pos.y << ',' << pos.z << std::endl;
                return true;
            }
            return false;
        },
        "origin[,<x>,<y>,<z>]", "get or set the origin position."));

        _commands.push_back(Command("material", [&](const std::string& _line){ 
            if (_line == "materials") {
                for (vera::MaterialsMap::iterator it = _uniforms.materials.begin(); it != _uniforms.materials.end(); it++)
                    std::cout << it->second->name << std::endl;
                return true;
            }
            else {
                std::vector<std::string> values = vera::split(_line,',');
                if (values.size() == 2 && values[0] == "material") {
                    for (vera::MaterialsMap::iterator it = _uniforms.materials.begin(); it != _uniforms.materials.end(); it++) {
                        if (it->second->name == values[1]) {
                            it->second->printDefines();
                            return true;
                        }
                    }
                }
            }

            return false;
        },
        "materials", "print all the materials names"));

        _commands.push_back(Command("blend", [&](const std::string& _line){ 
            std::vector<std::string> values = vera::split(_line,',');
            if (values.size() == 1) {
                if (getBlend() == vera::BLEND_NONE) std::cout << "none" << std::endl;
                else if (getBlend() == vera::BLEND_ALPHA) std::cout << "alpha" << std::endl;
                else if (getBlend() == vera::BLEND_ADD) std::cout << "add" << std::endl;
                else if (getBlend() == vera::BLEND_MULTIPLY) std::cout << "multiply" << std::endl;
                else if (getBlend() == vera::BLEND_SCREEN) std::cout << "screen" << std::endl;
                else if (getBlend() == vera::BLEND_SUBSTRACT) std::cout << "substract" << std::endl;
                
                return true;
            }
            else if (values.size() == 2) {
                if (values[1] == "none" || values[1] == "off") setBlend(vera::BLEND_NONE);
                else if (values[1] == "alpha") setBlend(vera::BLEND_ALPHA);
                else if (values[1] == "add") setBlend(vera::BLEND_ADD);
                else if (values[1] == "multiply") setBlend(vera::BLEND_MULTIPLY);
                else if (values[1] == "screen") setBlend(vera::BLEND_SCREEN);
                else if (values[1] == "substract") setBlend(vera::BLEND_SUBSTRACT);

                return true;
            }

            return false;
        },
        "blend[,alpha|add|multiply|screen|substract]", "get or set the blending modes"));

        _commands.push_back(Command("depth_test", [&](const std::string& _line){ 
            if (_line == "depth_test") {
                std::string rta = m_depth_test ? "on" : "off";
                std::cout <<  rta << std::endl; 
                return true;
            }
            else {
                std::vector<std::string> values = vera::split(_line,',');
                if (values.size() == 2) {
                    m_depth_test = (values[1] == "on");
                    return true;
                }
            }
            return false;
        },
        "depth_test[,on|off]", "turn on/off depth test"));

        _commands.push_back(Command("culling", [&](const std::string& _line){ 
            std::vector<std::string> values = vera::split(_line,',');
            if (values.size() == 1) {
                if (getCulling() == vera::CULL_NONE) std::cout << "none" << std::endl;
                else if (getCulling() == vera::CULL_FRONT) std::cout << "front" << std::endl;
                else if (getCulling() == vera::CULL_BACK) std::cout << "back" << std::endl;
                else if (getCulling() == vera::CULL_BOTH) std::cout << "both" << std::endl;

                return true;
            }
            else if (values.size() == 2) {
                if (values[1] == "none") setCulling(vera::CULL_NONE);
                else if (values[1] == "front") setCulling(vera::CULL_FRONT);
                else if (values[1] == "back") setCulling(vera::CULL_BACK);
                else if (values[1] == "both") setCulling(vera::CULL_BOTH);

                return true;
            }

            return false;
        },
        "culling[,none|front|back|both]", "get or set the culling modes"));
        
        _commands.push_back(Command("dynamic_shadows", [&](const std::string& _line){ 
            if (_line == "dynamic_shadows") {
                std::string rta = dynamicShadows ? "on" : "off";
                std::cout <<  rta << std::endl; 
                return true;
            }
            else {
                std::vector<std::string> values = vera::split(_line,',');
                if (values.size() == 2) {
                    dynamicShadows = (values[1] == "on");
                    return true;
                }
            }
            return false;
        },
        "dynamic_shadows[,on|off]", "get or set dynamic shadows"));

        _commands.push_back(Command("floor_color", [&](const std::string& _line){ 
            std::vector<std::string> values = vera::split(_line,',');
            if (values.size() == 4) {
                std::string str_color = "vec4("+values[1]+","+values[2]+","+values[3]+",1.0)"; 
                addDefine("FLOOR_COLOR",str_color);
                
                _uniforms.setGroundAlbedo( glm::vec3(vera::toFloat(values[1]), vera::toFloat(values[2]), vera::toFloat(values[3])) );
                _uniforms.activeCubemap = _uniforms.cubemaps["default"];
                return true;
            }
            else {
                glm::vec3 ground = _uniforms.getGroundAlbedo();
                std::cout << ground.x << ',' << ground.y << ',' << ground.z << std::endl;
                return true;
            }
            return false;
        },
        "floor_color[,<r>,<g>,<b>]", "get or set the ground color of the skybox."));
        
        _commands.push_back(Command("floor", [&](const std::string& _line) {
            std::vector<std::string> values = vera::split(_line,',');

            if (_line == "floor") {
                std::string rta = m_floor_subd > 0 ? vera::toString(m_floor_subd) : "off";
                std::cout << rta << std::endl; 
                return true;
            }
            else {
                if (values.size() == 2) {
                    if (values[1] == "toggle")
                        values[1] = m_floor_subd_target >= 0 ? "off" : "on";

                    if (values[1] == "off")
                        m_floor_subd_target = -1;
                    else if (values[1] == "on") {
                        if (m_floor_subd_target == -1)
                            m_floor_subd_target = 0;
                    }
                    else
                        m_floor_subd_target = vera::toInt(values[1]);
                    return true;
                }
            }
            return false;
        },
        "floor[,on|off|<subD_level>]", "show/hide floor or presice the subdivision level"));

        _commands.push_back(Command("grid", [&](const std::string& _line){
            if (_line == "grid") {
                std::string rta = showGrid ? "on" : "off";
                std::cout << rta << std::endl; 
                return true;
            }
            else {
                std::vector<std::string> values = vera::split(_line,',');
                if (values.size() == 2) {
                    if (values[1] == "toggle")
                        values[1] = showGrid ? "off" : "on";

                    showGrid = values[1] == "on";
                    return true;
                }
            }
            return false;
        },
        "grid[,on|off]", "show/hide grid"));

        _commands.push_back(Command("axis", [&](const std::string& _line){
            if (_line == "grid") {
                std::string rta = showAxis ? "on" : "off";
                std::cout << rta << std::endl; 
                return true;
            }
            else {
                std::vector<std::string> values = vera::split(_line,',');
                if (values.size() == 2) {
                    if (values[1] == "toggle")
                        values[1] = showAxis ? "off" : "on";

                    showAxis = values[1] == "on";
                    return true;
                }
            }
            return false;
        },
        "axis[,on|off]", "show/hide axis"));

        _commands.push_back(Command("bboxes", [&](const std::string& _line){
            if (_line == "bboxes") {
                std::string rta = showBBoxes ? "on" : "off";
                std::cout << rta << std::endl; 
                return true;
            }
            else {
                std::vector<std::string> values = vera::split(_line,',');
                if (values.size() == 2) {
                    if (values[1] == "toggle")
                        values[1] = showBBoxes ? "off" : "on";

                    showBBoxes = values[1] == "on";
                    return true;
                }
            }
            return false;
        },
        "bboxes[,on|off]", "show/hide models bounding boxes"));
        m_commands_loaded = true;
    }
}